

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O0

float anon_unknown.dwarf_113f::pw(float x,int y)

{
  float p;
  int y_local;
  float x_local;
  
  p = 1.0;
  x_local = x;
  for (y_local = y; y_local != 0; y_local = y_local >> 1) {
    if ((y_local & 1U) != 0) {
      p = x_local * p;
    }
    x_local = x_local * x_local;
  }
  return p;
}

Assistant:

float
pw (float x, int y)
{
    float p = 1;

    while (y)
    {
        if (y & 1) p *= x;

        x *= x;
        y >>= 1;
    }

    return p;
}